

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

bool __thiscall OrPattern::isMatch(OrPattern *this,ParserWalker *walker)

{
  pointer ppDVar1;
  DisjointPattern *pDVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    ppDVar1 = (this->orlist).
              super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar6 = (long)(this->orlist).
                  super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3;
    if (uVar6 <= uVar5) break;
    pDVar2 = ppDVar1[uVar5];
    iVar4 = (*(pDVar2->super_Pattern)._vptr_Pattern[7])(pDVar2,walker);
    uVar3 = uVar5 + 1;
  } while ((char)iVar4 == '\0');
  return uVar5 < uVar6;
}

Assistant:

bool OrPattern::isMatch(ParserWalker &walker) const

{
  for(int4 i=0;i<orlist.size();++i)
    if (orlist[i]->isMatch(walker))
      return true;
  return false;
}